

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O1

tjhandle tjInitDecompress(void)

{
  void *__s;
  tjhandle pvVar1;
  long in_FS_OFFSET;
  
  __s = malloc(0x6d8);
  if (__s != (void *)0x0) {
    memset(__s,0,0x6d8);
    *(undefined8 *)((long)__s + 0x608) = 0x726f727265206f4e;
    *(undefined1 *)((long)__s + 0x610) = 0;
    pvVar1 = _tjInitDecompress(__s);
    return pvVar1;
  }
  builtin_strncpy((char *)(in_FS_OFFSET + -0xb2),"ocation ",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -0xaa),"failure",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -0xc0),"(): Memo",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -0xb8),"ry alloc",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -0xd0),"tjInitDe",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -200),"compress",8);
  return (tjhandle)0x0;
}

Assistant:

static tjhandle _tjInitDecompress(tjinstance *this)
{
  static unsigned char buffer[1];

  /* This is also straight out of example.txt */
  this->dinfo.err = jpeg_std_error(&this->jerr.pub);
  this->jerr.pub.error_exit = my_error_exit;
  this->jerr.pub.output_message = my_output_message;
  this->jerr.emit_message = this->jerr.pub.emit_message;
  this->jerr.pub.emit_message = my_emit_message;
  this->jerr.pub.addon_message_table = turbojpeg_message_table;
  this->jerr.pub.first_addon_message = JMSG_FIRSTADDONCODE;
  this->jerr.pub.last_addon_message = JMSG_LASTADDONCODE;

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    free(this);
    return NULL;
  }

  jpeg_create_decompress(&this->dinfo);
  /* Make an initial call so it will create the source manager */
  jpeg_mem_src_tj(&this->dinfo, buffer, 1);

  this->init |= DECOMPRESS;
  return (tjhandle)this;
}